

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall
cmDocumentation::SetSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  cmDocumentationSection sec;
  cmDocumentationSection cStack_88;
  cmDocumentationSection local_50;
  
  cmDocumentationSection::cmDocumentationSection(&cStack_88,name);
  cmAppend<cmDocumentationEntry,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>
            (&cStack_88.Entries,docs);
  cmDocumentationSection::cmDocumentationSection(&local_50,&cStack_88);
  SetSection(this,name,&local_50);
  cmDocumentationSection::~cmDocumentationSection(&local_50);
  cmDocumentationSection::~cmDocumentationSection(&cStack_88);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 std::vector<cmDocumentationEntry>& docs)
{
  cmDocumentationSection sec{ name };
  sec.Append(docs);
  this->SetSection(name, std::move(sec));
}